

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

TracedValue * __thiscall
perfetto::TracedDictionary::AddItem
          (TracedValue *__return_storage_ptr__,TracedDictionary *this,char *param_3)

{
  EventContext *pEVar1;
  Message *this_00;
  allocator<char> local_49;
  string local_48;
  
  this_00 = protozero::Message::BeginNestedMessageInternal(this->message_,this->field_id_);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,param_3,&local_49);
  protos::pbzero::DebugAnnotation::set_name((DebugAnnotation *)this_00,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  pEVar1 = this->event_context_;
  __return_storage_ptr__->annotation_ = (DebugAnnotation *)this_00;
  __return_storage_ptr__->event_context_ = pEVar1;
  return __return_storage_ptr__;
}

Assistant:

TracedValue TracedDictionary::AddItem(DynamicString key) {
  PERFETTO_DCHECK(checked_scope_.is_active());
  protos::pbzero::DebugAnnotation* item =
      message_->BeginNestedMessage<protos::pbzero::DebugAnnotation>(field_id_);
  item->set_name(key.value);
  return TracedValue(item, event_context_, &checked_scope_);
}